

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

void __thiscall cmSetPropertyCommand::cmSetPropertyCommand(cmSetPropertyCommand *this)

{
  cmSetPropertyCommand *this_local;
  
  cmCommand::cmCommand(&this->super_cmCommand);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmSetPropertyCommand_00cbe810;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Names);
  std::__cxx11::string::string((string *)&this->PropertyName);
  std::__cxx11::string::string((string *)&this->PropertyValue);
  this->AppendMode = false;
  this->AppendAsString = false;
  this->Remove = true;
  return;
}

Assistant:

cmSetPropertyCommand::cmSetPropertyCommand()
{
  this->AppendMode = false;
  this->AppendAsString = false;
  this->Remove = true;
}